

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.c
# Opt level: O0

int64_t aom_highbd_sse_c(uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  int32_t diff;
  uint16_t *b;
  uint16_t *a;
  int64_t sse;
  int x;
  int y;
  int height_local;
  int width_local;
  int b_stride_local;
  uint8_t *b8_local;
  int a_stride_local;
  uint8_t *a8_local;
  
  sse = 0;
  a = (uint16_t *)((long)a8 << 1);
  b = (uint16_t *)((long)b8 << 1);
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width; x = x + 1) {
      sse = (int)(((uint)a[x] - (uint)b[x]) * ((uint)a[x] - (uint)b[x])) + sse;
    }
    a = a + a_stride;
    b = b + b_stride;
  }
  return sse;
}

Assistant:

int64_t aom_highbd_sse_c(const uint8_t *a8, int a_stride, const uint8_t *b8,
                         int b_stride, int width, int height) {
  int y, x;
  int64_t sse = 0;
  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const int32_t diff = (int32_t)(a[x]) - (int32_t)(b[x]);
      sse += diff * diff;
    }

    a += a_stride;
    b += b_stride;
  }
  return sse;
}